

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall parser::state::message(state *this,string *s)

{
  ind *in_RDI;
  error e;
  error *this_00;
  string *in_stack_ffffffffffffff68;
  error *in_stack_ffffffffffffff70;
  ind local_88;
  ind iStack_80;
  ind local_78;
  error *in_stack_ffffffffffffff90;
  error *in_stack_ffffffffffffff98;
  
  this_00 = (error *)&local_88;
  error::error(this_00);
  local_78 = in_RDI[2];
  local_88 = *in_RDI;
  iStack_80 = in_RDI[1];
  error::message(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  error::operator|=(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  error::~error(this_00);
  return;
}

Assistant:

void message(const std::string& s) {
			struct error e; e.pos = pos; e.message(s);
			err |= e;
		}